

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsItemDeactivated(void)

{
  ImGuiWindow *pIVar1;
  bool local_21;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  pIVar1 = GImGui->CurrentWindow;
  if (((pIVar1->DC).LastItemStatusFlags & 0x20U) == 0) {
    local_21 = false;
    if ((GImGui->ActiveIdPreviousFrame == (pIVar1->DC).LastItemId) &&
       (local_21 = false, GImGui->ActiveIdPreviousFrame != 0)) {
      local_21 = GImGui->ActiveId != (pIVar1->DC).LastItemId;
    }
    g._7_1_ = local_21;
  }
  else {
    g._7_1_ = ((pIVar1->DC).LastItemStatusFlags & 0x40U) != 0;
  }
  return g._7_1_;
}

Assistant:

bool ImGui::IsItemDeactivated()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->DC.LastItemStatusFlags & ImGuiItemStatusFlags_HasDeactivated)
        return (window->DC.LastItemStatusFlags & ImGuiItemStatusFlags_Deactivated) != 0;
    return (g.ActiveIdPreviousFrame == window->DC.LastItemId && g.ActiveIdPreviousFrame != 0 && g.ActiveId != window->DC.LastItemId);
}